

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

void FDrawInfo::EndDrawInfo(void)

{
  FDrawInfo *this;
  long lVar1;
  
  this = gl_drawinfo;
  lVar1 = 0xe0;
  do {
    GLDrawList::Reset((GLDrawList *)(&this->temporary + lVar1));
    lVar1 = lVar1 + 0x58;
  } while (lVar1 != 0x3a0);
  if (this->dldrawlists != (GLDrawList *)0x0) {
    lVar1 = 0;
    do {
      GLDrawList::Reset((GLDrawList *)((long)&(this->dldrawlists->walls).Array + lVar1));
      lVar1 = lVar1 + 0x58;
    } while (lVar1 != 0x2c0);
  }
  gl_drawinfo = this->next;
  ClearBuffers(this);
  TArray<FDrawInfo_*,_FDrawInfo_*>::Grow((TArray<FDrawInfo_*,_FDrawInfo_*> *)&di_list,1);
  di_list.mList.super_TArray<FDrawInfo_*,_FDrawInfo_*>.Array
  [di_list.mList.super_TArray<FDrawInfo_*,_FDrawInfo_*>.Count] = this;
  di_list.mList.super_TArray<FDrawInfo_*,_FDrawInfo_*>.Count =
       di_list.mList.super_TArray<FDrawInfo_*,_FDrawInfo_*>.Count + 1;
  return;
}

Assistant:

void FDrawInfo::EndDrawInfo()
{
	FDrawInfo * di = gl_drawinfo;

	for(int i=0;i<GLDL_TYPES;i++) di->drawlists[i].Reset();
	if (di->dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) di->dldrawlists[i].Reset();
	}
	gl_drawinfo=di->next;
	di_list.Release(di);
}